

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2_impl.h
# Opt level: O0

void store16(void *dst,uint16_t w)

{
  uint8_t *p;
  uint16_t w_local;
  void *dst_local;
  
  *(uint16_t *)dst = w;
  return;
}

Assistant:

static BLAKE2_INLINE void store16( void *dst, uint16_t w )
{
#if defined(NATIVE_LITTLE_ENDIAN)
  memcpy(dst, &w, sizeof w);
#else
  uint8_t *p = ( uint8_t * )dst;
  *p++ = ( uint8_t )w; w >>= 8;
  *p++ = ( uint8_t )w;
#endif
}